

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O0

spawn_ret_t
depspawn::spawn<std::function<void(int&,int)>,int&,int&>
          (function<void_(int_&,_int)> *f,int *args,int *args_1)

{
  bool bVar1;
  Workitem *this;
  Task *itask;
  reference_wrapper<int> *in_RSI;
  reference_wrapper<int> *in_RDI;
  function<void_(int_&,_int)> *unaff_retaddr;
  Workitem *in_stack_00000008;
  TaskPool *in_stack_00000010;
  Workitem *w;
  int nargs;
  arg_info *pargs;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  arg_info **in_stack_ffffffffffffffa8;
  LinkedListPool<depspawn::internal::Workitem,_true,_false> *in_stack_ffffffffffffffb0;
  
  internal::
  fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
            ((arg_info **)in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  if (internal::TP != (TaskPool *)0x0) {
    bVar1 = internal::TaskPool::is_running(internal::TP);
    if (bVar1) goto LAB_00127dcc;
  }
  internal::start_master();
LAB_00127dcc:
  this = LinkedListPool<depspawn::internal::Workitem,true,false>::
         malloc<depspawn::internal::arg_info*&,int_const&>
                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  internal::ref<int_&>::make(in_stack_ffffffffffffff98);
  internal::ref<int_&>::make(in_stack_ffffffffffffff98);
  itask = internal::TaskPool::
          build_task<std::function<void(int&,int)>const&,std::reference_wrapper<int>,std::reference_wrapper<int>>
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
  internal::Workitem::insert_in_worklist(this,itask);
  return;
}

Assistant:

inline internal::spawn_ret_t spawn(const Function& f, Args&&... args) {
    using parameter_types = typename internal::ParameterTypes<Function>::type;

    internal::arg_info *pargs = nullptr;
    const int nargs = internal::fill_args<typename boost::mpl::begin<parameter_types>::type>(pargs, std::forward<Args>(args)...);

#ifdef DEPSPAWN_USE_TBB
    if(!internal::master_task)
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(new (tbb::task::allocate_additional_child_of(*internal::master_task)) internal::runner<decltype(std::bind(f, internal::ref<Args&&>::make(args)...))>(w, f, std::forward<Args>(args)...));
#else
    if(!internal::TP || !internal::TP->is_running())
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(internal::TP->build_task(w, f, internal::ref<Args&&>::make(args)...));
#endif
  }